

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawData(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *child;
  int i;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImVector<ImDrawList_*> *out_render_list_local;
  
  (GImGui->IO).MetricsRenderWindows = (GImGui->IO).MetricsRenderWindows + 1;
  AddDrawListToDrawData(out_render_list,window->DrawList);
  for (child._4_4_ = 0; child._4_4_ < (window->DC).ChildWindows.Size; child._4_4_ = child._4_4_ + 1)
  {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(window->DC).ChildWindows,child._4_4_);
    window_00 = *ppIVar2;
    bVar1 = IsWindowActiveAndVisible(window_00);
    if (bVar1) {
      AddWindowToDrawData(out_render_list,window_00);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImVector<ImDrawList*>* out_render_list, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // clipped children may have been marked not active
            AddWindowToDrawData(out_render_list, child);
    }
}